

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::internal::UnitTestOptions::GetAbsolutePathToOutputFile_abi_cxx11_(void)

{
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  long *__s_00;
  char *pcVar4;
  size_t sVar5;
  _Alloc_hider _Var6;
  _Alloc_hider _Var7;
  char cVar8;
  string *in_RDI;
  FilePath output_name;
  FilePath result;
  string format;
  string s;
  FilePath local_198;
  allocator<char> local_171;
  FilePath local_170;
  FilePath local_150;
  FilePath local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  long local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  long local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  long local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  long local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,FLAGS_gtest_output_abi_cxx11_,
             DAT_001666d0 + FLAGS_gtest_output_abi_cxx11_);
  __s_00 = local_50[0];
  GetOutputFormat_abi_cxx11_();
  if (local_68 == 0) {
    paVar1 = &local_170.pathname_.field_2;
    local_170.pathname_._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"xml","");
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_170.pathname_._M_dataplus._M_p,
                      local_170.pathname_.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar4 = strchr((char *)__s_00,0x3a);
  if (pcVar4 == (char *)0x0) {
    UnitTest::GetInstance();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
               _M_dataplus._M_p,(allocator<char> *)&local_130);
    lVar3 = local_a8;
    paVar1 = &local_150.pathname_.field_2;
    if (local_b0 == &local_a0) {
      local_150.pathname_.field_2._8_4_ = local_a0._8_4_;
      local_150.pathname_.field_2._12_4_ = local_a0._12_4_;
      local_150.pathname_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_150.pathname_._M_dataplus._M_p = (pointer)local_b0;
    }
    local_150.pathname_.field_2._M_allocated_capacity._4_4_ = local_a0._M_allocated_capacity._4_4_;
    local_150.pathname_.field_2._M_allocated_capacity._0_4_ = local_a0._M_allocated_capacity._0_4_;
    local_a8 = 0;
    local_a0._M_allocated_capacity._0_4_ = local_a0._M_allocated_capacity._0_4_ & 0xffffff00;
    _Var6._M_p = local_150.pathname_._M_dataplus._M_p;
    _Var7._M_p = local_150.pathname_._M_dataplus._M_p;
    if (lVar3 != 0) {
      do {
        cVar8 = *_Var7._M_p;
        if (((cVar8 != '/') || (cVar8 = '/', _Var6._M_p == local_150.pathname_._M_dataplus._M_p)) ||
           (_Var6._M_p[-1] != '/')) {
          *_Var6._M_p = cVar8;
          _Var6._M_p = _Var6._M_p + 1;
        }
        _Var7._M_p = _Var7._M_p + 1;
      } while (_Var7._M_p != local_150.pathname_._M_dataplus._M_p + lVar3);
    }
    local_150.pathname_._M_string_length =
         (long)_Var6._M_p - (long)local_150.pathname_._M_dataplus._M_p;
    *_Var6._M_p = '\0';
    local_f0 = &local_e0;
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"test_detail","");
    lVar3 = local_e8;
    paVar2 = &local_198.pathname_.field_2;
    if (local_f0 == &local_e0) {
      local_198.pathname_.field_2._8_8_ = local_e0._8_8_;
      local_198.pathname_._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_198.pathname_._M_dataplus._M_p = (pointer)local_f0;
    }
    local_198.pathname_.field_2._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
    local_198.pathname_.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    _Var6._M_p = local_198.pathname_._M_dataplus._M_p;
    _Var7._M_p = local_198.pathname_._M_dataplus._M_p;
    if (lVar3 != 0) {
      do {
        cVar8 = *_Var7._M_p;
        if (((cVar8 != '/') || (cVar8 = '/', _Var6._M_p == local_198.pathname_._M_dataplus._M_p)) ||
           (_Var6._M_p[-1] != '/')) {
          *_Var6._M_p = cVar8;
          _Var6._M_p = _Var6._M_p + 1;
        }
        _Var7._M_p = _Var7._M_p + 1;
      } while (_Var7._M_p != local_198.pathname_._M_dataplus._M_p + lVar3);
    }
    local_198.pathname_._M_string_length =
         (long)_Var6._M_p - (long)local_198.pathname_._M_dataplus._M_p;
    *_Var6._M_p = '\0';
    local_f0 = &local_e0;
    FilePath::MakeFileName(&local_170,&local_150,&local_198,0,(char *)local_70);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char*>();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.pathname_._M_dataplus._M_p != &local_170.pathname_.field_2) {
      operator_delete(local_170.pathname_._M_dataplus._M_p,
                      local_170.pathname_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198.pathname_._M_dataplus._M_p != paVar2) {
      operator_delete(local_198.pathname_._M_dataplus._M_p,
                      local_198.pathname_.field_2._M_allocated_capacity + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                        local_e0._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.pathname_._M_dataplus._M_p != paVar1) {
      operator_delete(local_150.pathname_._M_dataplus._M_p,
                      local_150.pathname_.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 == &local_a0) goto LAB_0011f9a0;
    local_170.pathname_.field_2._M_allocated_capacity =
         CONCAT44(local_a0._M_allocated_capacity._4_4_,local_a0._M_allocated_capacity._0_4_);
    _Var6._M_p = (pointer)local_b0;
  }
  else {
    __s = pcVar4 + 1;
    local_90 = &local_80;
    sVar5 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,pcVar4 + sVar5 + 1);
    paVar1 = &local_170.pathname_.field_2;
    if (local_90 == &local_80) {
      local_170.pathname_.field_2._8_8_ = local_80._8_8_;
      local_170.pathname_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_170.pathname_._M_dataplus._M_p = (pointer)local_90;
    }
    local_170.pathname_.field_2._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
    local_170.pathname_.field_2._M_local_buf[0] = local_80._M_local_buf[0];
    _Var6._M_p = local_170.pathname_._M_dataplus._M_p;
    _Var7._M_p = local_170.pathname_._M_dataplus._M_p;
    if (local_88 != 0) {
      do {
        cVar8 = *_Var7._M_p;
        if (((cVar8 != '/') || (cVar8 = '/', _Var6._M_p == local_170.pathname_._M_dataplus._M_p)) ||
           (_Var6._M_p[-1] != '/')) {
          *_Var6._M_p = cVar8;
          _Var6._M_p = _Var6._M_p + 1;
        }
        _Var7._M_p = _Var7._M_p + 1;
      } while (_Var7._M_p != local_170.pathname_._M_dataplus._M_p + local_88);
    }
    local_170.pathname_._M_string_length =
         (long)_Var6._M_p - (long)local_170.pathname_._M_dataplus._M_p;
    *_Var6._M_p = '\0';
    local_80._M_local_buf[0] = '\0';
    local_88 = 0;
    _Var6._M_p = local_170.pathname_._M_dataplus._M_p;
    if (local_170.pathname_._M_string_length != 0) {
      _Var6._M_p = local_170.pathname_._M_dataplus._M_p +
                   (*local_170.pathname_._M_dataplus._M_p == '/');
    }
    local_90 = &local_80;
    if (_Var6._M_p == local_170.pathname_._M_dataplus._M_p) {
      UnitTest::GetInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,
                 ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                 _M_dataplus._M_p,&local_171);
      lVar3 = local_c8;
      local_198.pathname_._M_dataplus._M_p = (pointer)&local_198.pathname_.field_2;
      if (local_d0 == &local_c0) {
        local_198.pathname_.field_2._8_8_ = local_c0._8_8_;
      }
      else {
        local_198.pathname_._M_dataplus._M_p = (pointer)local_d0;
      }
      local_198.pathname_.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_
      ;
      local_198.pathname_.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      _Var6._M_p = local_198.pathname_._M_dataplus._M_p;
      _Var7._M_p = local_198.pathname_._M_dataplus._M_p;
      if (lVar3 != 0) {
        do {
          cVar8 = *_Var7._M_p;
          if (((cVar8 != '/') || (cVar8 = '/', _Var6._M_p == local_198.pathname_._M_dataplus._M_p))
             || (_Var6._M_p[-1] != '/')) {
            *_Var6._M_p = cVar8;
            _Var6._M_p = _Var6._M_p + 1;
          }
          _Var7._M_p = _Var7._M_p + 1;
        } while (_Var7._M_p != local_198.pathname_._M_dataplus._M_p + lVar3);
      }
      local_198.pathname_._M_string_length =
           (long)_Var6._M_p - (long)local_198.pathname_._M_dataplus._M_p;
      *_Var6._M_p = '\0';
      local_110 = &local_100;
      local_d0 = &local_c0;
      sVar5 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,__s,__s + sVar5);
      lVar3 = local_108;
      paVar2 = &local_130.pathname_.field_2;
      if (local_110 == &local_100) {
        local_130.pathname_.field_2._8_8_ = local_100._8_8_;
        local_130.pathname_._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_130.pathname_._M_dataplus._M_p = (pointer)local_110;
      }
      local_130.pathname_.field_2._M_allocated_capacity._1_7_ =
           local_100._M_allocated_capacity._1_7_;
      local_130.pathname_.field_2._M_local_buf[0] = local_100._M_local_buf[0];
      local_108 = 0;
      local_100._M_local_buf[0] = '\0';
      _Var6._M_p = local_130.pathname_._M_dataplus._M_p;
      _Var7._M_p = local_130.pathname_._M_dataplus._M_p;
      if (lVar3 != 0) {
        do {
          cVar8 = *_Var7._M_p;
          if (((cVar8 != '/') || (cVar8 = '/', _Var6._M_p == local_130.pathname_._M_dataplus._M_p))
             || (_Var6._M_p[-1] != '/')) {
            *_Var6._M_p = cVar8;
            _Var6._M_p = _Var6._M_p + 1;
          }
          _Var7._M_p = _Var7._M_p + 1;
        } while (_Var7._M_p != local_130.pathname_._M_dataplus._M_p + lVar3);
      }
      local_130.pathname_._M_string_length =
           (long)_Var6._M_p - (long)local_130.pathname_._M_dataplus._M_p;
      *_Var6._M_p = '\0';
      local_110 = &local_100;
      FilePath::ConcatPaths(&local_150,&local_198,&local_130);
      std::__cxx11::string::operator=((string *)&local_170,(string *)&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.pathname_._M_dataplus._M_p != &local_150.pathname_.field_2) {
        operator_delete(local_150.pathname_._M_dataplus._M_p,
                        local_150.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.pathname_._M_dataplus._M_p != paVar2) {
        operator_delete(local_130.pathname_._M_dataplus._M_p,
                        local_130.pathname_.field_2._M_allocated_capacity + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,
                        CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198.pathname_._M_dataplus._M_p != &local_198.pathname_.field_2) {
        operator_delete(local_198.pathname_._M_dataplus._M_p,
                        local_198.pathname_.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,
                                          local_c0._M_local_buf[0]) + 1);
      }
    }
    if ((local_170.pathname_._M_string_length == 0) ||
       (local_170.pathname_._M_dataplus._M_p[local_170.pathname_._M_string_length - 1] != '/')) {
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
    }
    else {
      GetCurrentExecutableName();
      GetOutputFormat_abi_cxx11_();
      FilePath::GenerateUniqueFileName
                (&local_150,&local_170,&local_198,local_130.pathname_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.pathname_._M_dataplus._M_p != &local_130.pathname_.field_2) {
        operator_delete(local_130.pathname_._M_dataplus._M_p,
                        local_130.pathname_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198.pathname_._M_dataplus._M_p != &local_198.pathname_.field_2) {
        operator_delete(local_198.pathname_._M_dataplus._M_p,
                        local_198.pathname_.field_2._M_allocated_capacity + 1);
      }
      (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
      std::__cxx11::string::_M_construct<char*>();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.pathname_._M_dataplus._M_p != &local_150.pathname_.field_2) {
        operator_delete(local_150.pathname_._M_dataplus._M_p,
                        local_150.pathname_.field_2._M_allocated_capacity + 1);
      }
    }
    _Var6._M_p = local_170.pathname_._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.pathname_._M_dataplus._M_p == paVar1) goto LAB_0011f9a0;
  }
  operator_delete(_Var6._M_p,local_170.pathname_.field_2._M_allocated_capacity + 1);
LAB_0011f9a0:
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string UnitTestOptions::GetAbsolutePathToOutputFile() {
  std::string s = GTEST_FLAG_GET(output);
  const char* const gtest_output_flag = s.c_str();

  std::string format = GetOutputFormat();
  if (format.empty()) format = std::string(kDefaultOutputFormat);

  const char* const colon = strchr(gtest_output_flag, ':');
  if (colon == nullptr)
    return internal::FilePath::MakeFileName(
               internal::FilePath(
                   UnitTest::GetInstance()->original_working_dir()),
               internal::FilePath(kDefaultOutputFile), 0, format.c_str())
        .string();

  internal::FilePath output_name(colon + 1);
  if (!output_name.IsAbsolutePath())
    output_name = internal::FilePath::ConcatPaths(
        internal::FilePath(UnitTest::GetInstance()->original_working_dir()),
        internal::FilePath(colon + 1));

  if (!output_name.IsDirectory()) return output_name.string();

  internal::FilePath result(internal::FilePath::GenerateUniqueFileName(
      output_name, internal::GetCurrentExecutableName(),
      GetOutputFormat().c_str()));
  return result.string();
}